

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O1

SUNErrCode SUNHashMap_Destroy(SUNHashMap *map,_func_void_void_ptr *freevalue)

{
  void *pvVar1;
  SUNHashMap pSVar2;
  long lVar3;
  
  if (freevalue != (_func_void_void_ptr *)0x0 && map != (SUNHashMap *)0x0) {
    pSVar2 = *map;
    if (0 < pSVar2->max_size) {
      lVar3 = 0;
      do {
        if ((pSVar2->buckets[lVar3] != (SUNHashMapKeyValue)0x0) &&
           (pvVar1 = pSVar2->buckets[lVar3]->value, pvVar1 != (void *)0x0)) {
          (*freevalue)(pvVar1);
        }
        if ((*map)->buckets[lVar3] != (SUNHashMapKeyValue)0x0) {
          free((*map)->buckets[lVar3]);
        }
        lVar3 = lVar3 + 1;
        pSVar2 = *map;
      } while (lVar3 < pSVar2->max_size);
    }
    if (pSVar2->buckets != (SUNHashMapKeyValue *)0x0) {
      free(pSVar2->buckets);
    }
    if (*map != (SUNHashMap)0x0) {
      free(*map);
    }
    *map = (SUNHashMap)0x0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNHashMap_Destroy(SUNHashMap* map, void (*freevalue)(void* ptr))
{
  int i;

  if (map == NULL || freevalue == NULL) { return SUN_SUCCESS; }

  for (i = 0; i < (*map)->max_size; i++)
  {
    if ((*map)->buckets[i] && (*map)->buckets[i]->value)
    {
      freevalue((*map)->buckets[i]->value);
    }

    if ((*map)->buckets[i]) { free((*map)->buckets[i]); }
  }
  if ((*map)->buckets) { free((*map)->buckets); }
  if (*map) { free(*map); }
  *map = NULL;

  return SUN_SUCCESS;
}